

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O3

char * node_prefix(lyd_node *node)

{
  int iVar1;
  lys_module *plVar2;
  
  if (node->schema == (lysc_node *)0x0) {
    iVar1 = *(int *)((long)&node[1].meta + 4);
    if (iVar1 != 3) {
      if (iVar1 == 4) {
        return (char *)node[1].next;
      }
      ly_log((ly_ctx *)node[2].schema,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
             ,0xa9);
      return (char *)0x0;
    }
    plVar2 = ly_ctx_get_module_implemented_ns((ly_ctx *)node[2].schema,(char *)node[1].next);
    if (plVar2 == (lys_module *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    plVar2 = node->schema->module;
  }
  return plVar2->name;
}

Assistant:

static const char *
node_prefix(const struct lyd_node *node)
{
    if (node->schema) {
        return node->schema->module->name;
    } else {
        struct lyd_node_opaq *onode = (struct lyd_node_opaq *)node;
        const struct lys_module *mod;

        switch (onode->format) {
        case LY_VALUE_JSON:
            return onode->name.module_name;
        case LY_VALUE_XML:
            mod = ly_ctx_get_module_implemented_ns(onode->ctx, onode->name.module_ns);
            if (!mod) {
                return NULL;
            }
            return mod->name;
        default:
            /* cannot be created */
            LOGINT(LYD_CTX(node));
        }
    }

    return NULL;
}